

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.h
# Opt level: O2

void __thiscall
slang::ast::NewCovergroupExpression::visitExprs<slang::ast::SampledValueExprVisitor&>
          (NewCovergroupExpression *this,SampledValueExprVisitor *visitor)

{
  pointer ppEVar1;
  size_type sVar2;
  long lVar3;
  
  ppEVar1 = (this->arguments).data_;
  sVar2 = (this->arguments).size_;
  for (lVar3 = 0; sVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
    Expression::visit<slang::ast::SampledValueExprVisitor&>
              (*(Expression **)((long)ppEVar1 + lVar3),visitor);
  }
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto arg : arguments)
            arg->visit(visitor);
    }